

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  tile_details *ptVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint16 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint i;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar10 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar4 = (ulong)(this->m_tiles).m_size;
  uVar5 = (uVar4 * data) / uVar10;
  do {
    if ((uint)(((data + 1) * uVar4) / uVar10) <= (uint)uVar5) {
      return;
    }
    uVar6 = uVar5 & 0xffffffff;
    if ((this->m_tiles).m_p[uVar6].pixels.m_size != 0) {
      uVar9 = 0;
      while (uVar9 < this->m_num_alpha_blocks) {
        ptVar3 = (this->m_tiles).m_p;
        fVar12 = 1e+37;
        uVar8 = 0;
        for (uVar11 = 0; uVar7 = (uint16)uVar8, *(uint *)((long)pData_ptr + 0xa0) != uVar11;
            uVar11 = uVar11 + 1) {
          uVar1 = *(undefined8 *)(*(long *)((long)pData_ptr + 0x98) + uVar11 * 8);
          uVar2 = *(undefined8 *)ptVar3[uVar6].alpha_endpoints[uVar9].m_s;
          fVar13 = (float)uVar1 - (float)uVar2;
          fVar14 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
          fVar13 = fVar14 * fVar14 + fVar13 * fVar13;
          if (fVar13 < fVar12) {
            if ((fVar13 == 0.0) && (!NAN(fVar13))) {
              uVar7 = (uint16)uVar11;
              break;
            }
            uVar8 = uVar11 & 0xffffffff;
            fVar12 = fVar13;
          }
        }
        uVar9 = uVar9 + 1;
        ptVar3[uVar6].cluster_indices[uVar9 & 0xffffffff] = uVar7;
      }
    }
    uVar5 = (ulong)((uint)uVar5 + 1);
  } while( true );
}

Assistant:

void dxt_hc::determine_alpha_endpoint_clusters_task(uint64 data, void* pData_ptr) {
  tree_clusterizer<vec2F>* vq = (tree_clusterizer<vec2F>*)pData_ptr;
  const crnlib::vector<vec2F>& codebook = vq->get_codebook();
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++) {
    if (m_tiles[t].pixels.size()) {
      for (uint a = 0; a < m_num_alpha_blocks; a++) {
        const vec2F& v = m_tiles[t].alpha_endpoints[a];
        float best_dist = math::cNearlyInfinite;
        uint best_index = 0;
        for (uint i = 0; i < codebook.size(); i++) {
          float dist = (codebook[i][0] - v[0]) * (codebook[i][0] - v[0]) + (codebook[i][1] - v[1]) * (codebook[i][1] - v[1]);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = i;
            if (best_dist == 0.0f)
              break;
          }
        }
        m_tiles[t].cluster_indices[cAlpha0 + a] = best_index;
      }
    }
  }
}